

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

void __thiscall EthUdpPort::~EthUdpPort(EthUdpPort *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SocketInternals *this_00;
  pointer pcVar2;
  
  (this->super_EthBasePort).super_BasePort._vptr_BasePort = (_func_int **)&PTR_Init_00122978;
  SocketInternals::Close(this->sockPtr);
  this_00 = this->sockPtr;
  if (this_00 != (SocketInternals *)0x0) {
    SocketInternals::~SocketInternals(this_00);
    operator_delete(this_00,0x68);
  }
  pcVar2 = (this->MulticastIP)._M_dataplus._M_p;
  paVar1 = &(this->MulticastIP).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->ServerIP)._M_dataplus._M_p;
  paVar1 = &(this->ServerIP).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  EthBasePort::~EthBasePort(&this->super_EthBasePort);
  return;
}

Assistant:

EthUdpPort::~EthUdpPort()
{
    Cleanup();
    delete sockPtr;
}